

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O2

parse_status_t parser_parse_headers(http_parser_t *parser)

{
  membuffer *m;
  membuffer *m_00;
  char cVar1;
  size_t sVar2;
  parse_status_t pVar3;
  int iVar4;
  int iVar5;
  http_header_t *phVar6;
  undefined8 *item;
  ListNode *pLVar7;
  memptr token;
  memptr hdr_value;
  token_type_t tok_type;
  LinkedList *local_38;
  
  if ((parser->position != POS_HEADERS) && (parser->ent_position != 6)) {
    __assert_fail("parser->position == (parser_pos_t)POS_HEADERS || parser->ent_position == ENTREAD_CHUNKY_HEADERS"
                  ,".upnp/src/genlib/net/http/httpparser.c",0x5c8,
                  "parse_status_t parser_parse_headers(http_parser_t *)");
  }
  local_38 = &(parser->msg).headers;
LAB_001160ee:
  do {
    sVar2 = (parser->scanner).cursor;
    pVar3 = scanner_get_token(&parser->scanner,&token,&tok_type);
    if (pVar3 != PARSE_OK) {
LAB_001162cc:
      (parser->scanner).cursor = sVar2;
      return pVar3;
    }
    if (tok_type != TT_IDENTIFIER) {
      if (tok_type != TT_CRLF) {
        return PARSE_FAILURE;
      }
      if (((parser->msg).is_request != 0) && ((parser->msg).method == HTTPMETHOD_POST)) {
        parser->position = POS_COMPLETE;
        return PARSE_SUCCESS;
      }
      parser->position = POS_ENTITY;
      return PARSE_OK;
    }
    pVar3 = match(&parser->scanner," : %R%c",&hdr_value);
    if (pVar3 != PARSE_OK) goto LAB_001162cc;
    iVar4 = map_str_to_int(token.buf,token.length,Http_Header_Names,0x21,0);
    if (iVar4 == -1) {
      cVar1 = token.buf[token.length];
      token.buf[token.length] = '\0';
      phVar6 = httpmsg_find_hdr_str(&parser->msg,token.buf);
      token.buf[token.length] = cVar1;
      iVar4 = -1;
    }
    else {
      iVar4 = Http_Header_Names[iVar4].id;
      if (iVar4 == 0x13) {
        (parser->msg).method = SOAPMETHOD_POST;
      }
      phVar6 = httpmsg_find_hdr(&parser->msg,iVar4,(memptr *)0x0);
    }
    if (phVar6 == (http_header_t *)0x0) {
      item = (undefined8 *)malloc(0x58);
      if (item == (undefined8 *)0x0) goto LAB_001162c0;
      m = (membuffer *)(item + 7);
      membuffer_init(m);
      m_00 = (membuffer *)(item + 3);
      membuffer_init(m_00);
      if (hdr_value.length == 0) {
        hdr_value.buf = &parser_parse_headers::zero;
        hdr_value.length = 1;
      }
      iVar5 = membuffer_assign(m,token.buf,token.length);
      if ((iVar5 == 0) &&
         (iVar5 = membuffer_assign(m_00,hdr_value.buf,hdr_value.length), iVar5 == 0)) {
        *item = item[7];
        item[1] = item[8];
        *(int *)(item + 2) = iVar4;
        pLVar7 = ListAddTail(local_38,item);
        if (pLVar7 != (ListNode *)0x0) goto LAB_001160ee;
      }
      membuffer_destroy(m_00);
      membuffer_destroy(m);
      free(item);
LAB_001162c0:
      parser->http_error_code = 500;
      return PARSE_FAILURE;
    }
    if (hdr_value.length != 0) {
      iVar4 = membuffer_append_str(&phVar6->value,", ");
      iVar5 = membuffer_append(&phVar6->value,hdr_value.buf,hdr_value.length);
      if ((iVar4 == -0x68) || (iVar5 == -0x68)) goto LAB_001162c0;
    }
  } while( true );
}

Assistant:

parse_status_t parser_parse_headers(http_parser_t *parser)
{
	parse_status_t status;
	memptr token;
	memptr hdr_value;
	token_type_t tok_type;
	scanner_t *scanner = &parser->scanner;
	size_t save_pos;
	http_header_t *header;
	int header_id;
	int ret = 0;
	int index;
	http_header_t *orig_header;
	char save_char;
	int ret2;
	static char zero = 0;

	assert(parser->position == (parser_pos_t)POS_HEADERS ||
		parser->ent_position == ENTREAD_CHUNKY_HEADERS);

	while (1) {
		save_pos = scanner->cursor;
		/* check end of headers */
		status = scanner_get_token(scanner, &token, &tok_type);
		if (status != (parse_status_t)PARSE_OK) {
			/* pushback tokens; useful only on INCOMPLETE error */
			scanner->cursor = save_pos;
			return status;
		}
		switch (tok_type) {
		case TT_CRLF:
			/* end of headers */
			if ((parser->msg.is_request) &&
				(parser->msg.method ==
					(http_method_t)HTTPMETHOD_POST)) {
				parser->position =
					POS_COMPLETE; /*post entity parsing */
				/*is handled separately  */
				return PARSE_SUCCESS;
			}
			parser->position = POS_ENTITY; /* read entity next */
			return PARSE_OK;
		case TT_IDENTIFIER:
			/* not end; read header */
			break;
		default:
			return PARSE_FAILURE; /* didn't see header name */
		}
		status = match(scanner, " : %R%c", &hdr_value);
		if (status != (parse_status_t)PARSE_OK) {
			/* pushback tokens; useful only on INCOMPLETE error */
			scanner->cursor = save_pos;
			return status;
		}
		/* add header */
		/* find header */
		index = map_str_to_int(token.buf,
			token.length,
			Http_Header_Names,
			NUM_HTTP_HEADER_NAMES,
			0);
		if (index != -1) {
			/*Check if it is a soap header */
			if (Http_Header_Names[index].id == HDR_SOAPACTION) {
				parser->msg.method = SOAPMETHOD_POST;
			}
			header_id = Http_Header_Names[index].id;
			orig_header =
				httpmsg_find_hdr(&parser->msg, header_id, NULL);
		} else {
			header_id = HDR_UNKNOWN;
			save_char = token.buf[token.length];
			token.buf[token.length] = '\0';
			orig_header =
				httpmsg_find_hdr_str(&parser->msg, token.buf);
			token.buf[token.length] = save_char; /* restore */
		}
		if (orig_header == NULL) {
			/* add new header */
			header = (http_header_t *)malloc(sizeof(http_header_t));
			if (header == NULL) {
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			membuffer_init(&header->name_buf);
			membuffer_init(&header->value);
			/* value can be 0 length */
			if (hdr_value.length == (size_t)0) {
				hdr_value.buf = &zero;
				hdr_value.length = (size_t)1;
			}
			/* save in header in buffers */
			if (membuffer_assign(&header->name_buf,
				    token.buf,
				    token.length) ||
				membuffer_assign(&header->value,
					hdr_value.buf,
					hdr_value.length)) {
				/* not enough mem */
				membuffer_destroy(&header->value);
				membuffer_destroy(&header->name_buf);
				free(header);
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			header->name.buf = header->name_buf.buf;
			header->name.length = header->name_buf.length;
			header->name_id = header_id;
			if (!ListAddTail(&parser->msg.headers, header)) {
				membuffer_destroy(&header->value);
				membuffer_destroy(&header->name_buf);
				free(header);
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
		} else if (hdr_value.length > (size_t)0) {
			/* append value to existing header */
			/* append space */
			ret = membuffer_append_str(&orig_header->value, ", ");
			/* append continuation of header value */
			ret2 = membuffer_append(&orig_header->value,
				hdr_value.buf,
				hdr_value.length);
			if (ret == UPNP_E_OUTOF_MEMORY ||
				ret2 == UPNP_E_OUTOF_MEMORY) {
				/* not enuf mem */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
		}
	} /* end while */
}